

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

string * __thiscall embree::FileName::name_abi_cxx11_(string *__return_storage_ptr__,FileName *this)

{
  std::__cxx11::string::rfind((char)this,0x2f);
  std::__cxx11::string::rfind((char)this,0x2e);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)this);
  return __return_storage_ptr__;
}

Assistant:

std::string FileName::name() const {
    size_t start = filename.find_last_of(path_sep);
    if (start == std::string::npos) start = 0; else start++;
    size_t end = filename.find_last_of('.');
    if (end == std::string::npos || end < start) end = filename.size();
    return filename.substr(start, end - start);
  }